

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonparser.cpp
# Opt level: O3

ParsedJson *
build_parsed_json(ParsedJson *__return_storage_ptr__,uint8_t *buf,size_t len,bool reallocifneeded)

{
  bool bVar1;
  bool bVar2;
  
  ParsedJson::ParsedJson(__return_storage_ptr__);
  bVar1 = ParsedJson::allocateCapacity(__return_storage_ptr__,len,0x400);
  if (bVar1) {
    bVar1 = json_parse(buf,len,__return_storage_ptr__,reallocifneeded);
    bVar2 = ParsedJson::isValid(__return_storage_ptr__);
    if (bVar1 != bVar2) {
      __assert_fail("ok == pj.isValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gian99Santos[P]simdjson/src/jsonparser.cpp"
                    ,0x3e,"ParsedJson build_parsed_json(const uint8_t *, size_t, bool)");
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failure during memory allocation ",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  return __return_storage_ptr__;
}

Assistant:

WARN_UNUSED
ParsedJson build_parsed_json(const uint8_t *buf, size_t len, bool reallocifneeded) {
  ParsedJson pj;
  bool ok = pj.allocateCapacity(len);
  if(ok) {
    ok = json_parse(buf, len, pj, reallocifneeded);
    assert(ok == pj.isValid());
  } else {
    std::cerr << "failure during memory allocation " << std::endl;
  }
  return pj;
}